

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError BuildDeviceList(PaAlsaHostApiRepresentation *alsaApi)

{
  PaUtilAllocationGroup *pPVar1;
  PaAlsaHostApiRepresentation *alsaApi_00;
  HwDevInfo *devInfo_00;
  PaAlsaDeviceInfo *deviceHwInfo;
  size_t sVar2;
  snd_ctl_t *psVar3;
  uint uVar4;
  snd_pcm_info_t *psVar5;
  PaUtilHostApiRepresentation *pPVar6;
  int iVar7;
  int iVar8;
  char *pcVar9;
  size_t sVar10;
  snd_ctl_card_info_t *psVar11;
  snd_pcm_info_t *__s;
  pthread_t pVar12;
  snd_config_iterator_t p_Var13;
  snd_config_iterator_t p_Var14;
  snd_config_t *psVar15;
  char *pcVar16;
  HwDevInfo *pHVar17;
  void *pvVar18;
  ulong uVar19;
  long lVar20;
  undefined8 uStack_220;
  PaUtilAllocationGroup *local_218;
  PaUtilAllocationGroup *local_210;
  long local_208;
  long local_200;
  long local_1f8;
  snd_config_iterator_t local_1f0;
  long local_1e8;
  bool local_1d9;
  PaAlsaHostApiRepresentation *local_1d8;
  bool local_1c9;
  HwDevInfo *local_1c8;
  HwDevInfo *hwInfo_1;
  PaAlsaDeviceInfo *devInfo_1;
  HwDevInfo *hwInfo;
  PaAlsaDeviceInfo *devInfo;
  int local_1a0;
  int __pa_unsure_error_id_3;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  snd_config_t *tp;
  snd_config_t *n;
  HwDevInfo *predefined;
  char *deviceName_1;
  char *alsaDeviceName_1;
  char *pcStack_168;
  int err;
  char *idStr;
  char *tpStr;
  snd_config_iterator_t next;
  snd_config_iterator_t i_1;
  int local_140;
  int __pa_unsure_error_id;
  int hasCapture;
  int hasPlayback;
  size_t len;
  char *infoName;
  char *deviceName;
  char *alsaDeviceName;
  char buf [50];
  snd_ctl_t *ctl;
  char *pcStack_d0;
  int devIdx_1;
  char *cardName;
  size_t __alsa_alloca_size_1;
  size_t __alsa_alloca_size;
  char alsaCardName [50];
  char *hwPrefix;
  int local_70;
  int usePlughw;
  int blocking;
  int res;
  snd_pcm_info_t *pcmInfo;
  snd_config_t *topNode;
  HwDevInfo *hwDevInfos;
  size_t i;
  size_t maxDeviceNames;
  size_t numDeviceNames;
  snd_ctl_card_info_t *psStack_30;
  PaError result;
  snd_ctl_card_info_t *cardInfo;
  int devIdx;
  int cardIdx;
  PaAlsaDeviceInfo *deviceInfoArray;
  PaUtilHostApiRepresentation *baseApi;
  PaAlsaHostApiRepresentation *alsaApi_local;
  
  cardInfo._4_4_ = 0xffffffff;
  cardInfo._0_4_ = 0;
  numDeviceNames._4_4_ = 0;
  maxDeviceNames = 0;
  i = 1;
  topNode = (snd_config_t *)0x0;
  pcmInfo = (snd_pcm_info_t *)0x0;
  local_70 = 1;
  hwPrefix._4_4_ = 0;
  stack0xffffffffffffff80 = "";
  uStack_220 = 0x113561;
  deviceInfoArray = (PaAlsaDeviceInfo *)alsaApi;
  baseApi = &alsaApi->baseHostApiRep;
  pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
  if (pcVar9 != (char *)0x0) {
    uStack_220 = 0x113573;
    pcVar9 = getenv("PA_ALSA_INITIALIZE_BLOCK");
    uStack_220 = 0x11357b;
    iVar7 = atoi(pcVar9);
    if (iVar7 != 0) {
      local_70 = 0;
    }
  }
  uStack_220 = 0x113593;
  pcVar9 = getenv("PA_ALSA_PLUGHW");
  if (pcVar9 != (char *)0x0) {
    uStack_220 = 0x1135a5;
    pcVar9 = getenv("PA_ALSA_PLUGHW");
    uStack_220 = 0x1135ad;
    iVar7 = atoi(pcVar9);
    if (iVar7 != 0) {
      hwPrefix._4_4_ = 1;
      stack0xffffffffffffff80 = "plug";
    }
  }
  *(undefined4 *)&(deviceInfoArray->baseDeviceInfo).field_0x1c = 0xffffffff;
  *(undefined4 *)&(deviceInfoArray->baseDeviceInfo).defaultLowInputLatency = 0xffffffff;
  cardInfo._4_4_ = 0xffffffff;
  uStack_220 = 0x1135ea;
  sVar10 = (*(code *)alsa_snd_ctl_card_info_sizeof)();
  lVar20 = -(sVar10 + 0xf & 0xfffffffffffffff0);
  psVar11 = (snd_ctl_card_info_t *)((long)&local_218 + lVar20);
  __alsa_alloca_size_1 = sVar10;
  psStack_30 = psVar11;
  *(undefined8 *)((long)&uStack_220 + lVar20) = 0x11361f;
  memset(psVar11,0,sVar10);
  *(undefined8 *)((long)&uStack_220 + lVar20) = 0x11362a;
  pcVar9 = (char *)(*(code *)alsa_snd_pcm_info_sizeof)();
  __s = (snd_pcm_info_t *)(psVar11 + -((ulong)(pcVar9 + 0xf) & 0xfffffffffffffff0));
  cardName = pcVar9;
  *(undefined8 *)(__s + -8) = 0x11365f;
  memset(__s,0,(size_t)pcVar9);
  while( true ) {
    *(undefined8 *)(__s + -8) = 0x11366b;
    iVar7 = (*alsa_snd_card_next)((int *)((long)&cardInfo + 4));
    local_1c9 = iVar7 == 0 && -1 < (int)cardInfo._4_4_;
    if (iVar7 != 0 || -1 >= (int)cardInfo._4_4_) break;
    ctl._4_4_ = 0xffffffff;
    uVar19 = (ulong)cardInfo._4_4_;
    *(undefined8 *)(__s + -8) = 0x1136bd;
    snprintf((char *)&__alsa_alloca_size,0x32,"hw:%d",uVar19);
    *(undefined8 *)(__s + -8) = 0x1136d6;
    iVar7 = (*alsa_snd_ctl_open)((snd_ctl_t **)(buf + 0x30),(char *)&__alsa_alloca_size,0);
    psVar11 = psStack_30;
    psVar3 = stack0xffffffffffffff20;
    if (-1 < iVar7) {
      *(undefined8 *)(__s + -8) = 0x1136f1;
      (*alsa_snd_ctl_card_info)(psVar3,psVar11);
      psVar11 = psStack_30;
      local_1d8 = (PaAlsaHostApiRepresentation *)baseApi;
      *(undefined8 *)(__s + -8) = 0x113709;
      pcVar9 = (*alsa_snd_ctl_card_info_get_name)(psVar11);
      alsaApi_00 = local_1d8;
      *(undefined8 *)(__s + -8) = 0x11371f;
      paUtilErr_ = PaAlsa_StrDup(alsaApi_00,&stack0xffffffffffffff30,pcVar9);
      if (paUtilErr_ < 0) {
        *(undefined8 *)(__s + -8) = 0x113746;
        PaUtil_DebugPrint(
                         "Expression \'PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo ))\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1296\n"
                         );
        return paUtilErr_;
      }
      while( true ) {
        psVar3 = stack0xffffffffffffff20;
        *(undefined8 *)(__s + -8) = 0x11376f;
        iVar7 = (*alsa_snd_ctl_pcm_next_device)(psVar3,(int *)((long)&ctl + 4));
        pcVar9 = stack0xffffffffffffff80;
        psVar3 = stack0xffffffffffffff20;
        local_1d9 = iVar7 == 0 && -1 < (int)ctl._4_4_;
        if (iVar7 != 0 || -1 >= (int)ctl._4_4_) break;
        __pa_unsure_error_id = 0;
        local_140 = 0;
        uVar19 = (ulong)ctl._4_4_;
        *(undefined8 *)(__s + -8) = 0x1137dd;
        snprintf((char *)&alsaDeviceName,0x32,"%s%s,%d",pcVar9,&__alsa_alloca_size,uVar19);
        uVar4 = ctl._4_4_;
        *(undefined8 *)(__s + -8) = 0x1137f0;
        (*(code *)alsa_snd_pcm_info_set_device)(__s,uVar4);
        *(undefined8 *)(__s + -8) = 0x1137ff;
        (*(code *)alsa_snd_pcm_info_set_subdevice)(__s,0);
        *(undefined8 *)(__s + -8) = 0x113811;
        (*alsa_snd_pcm_info_set_stream)(__s,SND_PCM_STREAM_CAPTURE);
        psVar3 = stack0xffffffffffffff20;
        *(undefined8 *)(__s + -8) = 0x113825;
        iVar7 = (*alsa_snd_ctl_pcm_info)(psVar3,__s);
        if (-1 < iVar7) {
          local_140 = 1;
        }
        *(undefined8 *)(__s + -8) = 0x113843;
        (*alsa_snd_pcm_info_set_stream)(__s,SND_PCM_STREAM_PLAYBACK);
        psVar3 = stack0xffffffffffffff20;
        *(undefined8 *)(__s + -8) = 0x113857;
        iVar7 = (*alsa_snd_ctl_pcm_info)(psVar3,__s);
        if (-1 < iVar7) {
          __pa_unsure_error_id = 1;
        }
        if ((__pa_unsure_error_id != 0) || (local_140 != 0)) {
          *(undefined8 *)(__s + -8) = 0x11388a;
          pcVar16 = (*alsa_snd_pcm_info_get_name)(__s);
          pcVar9 = pcStack_d0;
          *(undefined8 *)(__s + -8) = 0x113899;
          pcVar16 = SkipCardDetailsInName(pcVar16,pcVar9);
          pcVar9 = pcStack_d0;
          len = (size_t)pcVar16;
          *(undefined8 *)(__s + -8) = 0x1138ca;
          iVar7 = snprintf((char *)0x0,0,"%s: %s (%s)",pcVar9,pcVar16,&alsaDeviceName);
          pPVar1 = (PaUtilAllocationGroup *)baseApi[3].Terminate;
          _hasCapture = (long)(iVar7 + 1);
          *(undefined8 *)(__s + -8) = 0x1138ed;
          pcVar16 = (char *)PaUtil_GroupAllocateMemory(pPVar1,(long)(iVar7 + 1));
          pcVar9 = pcStack_d0;
          sVar2 = len;
          sVar10 = _hasCapture;
          infoName = pcVar16;
          if (pcVar16 == (char *)0x0) {
            *(undefined8 *)(__s + -8) = 0x113916;
            PaUtil_DebugPrint(
                             "Expression \'deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1332\n"
                             );
            return -0x2708;
          }
          *(undefined8 *)(__s + -8) = 0x113955;
          snprintf(pcVar16,sVar10,"%s: %s (%s)",pcVar9,sVar2,&alsaDeviceName);
          psVar15 = topNode;
          maxDeviceNames = maxDeviceNames + 1;
          if ((topNode == (snd_config_t *)0x0) || (i < maxDeviceNames)) {
            sVar10 = i << 6;
            i = i << 1;
            *(undefined8 *)(__s + -8) = 0x11398e;
            topNode = (snd_config_t *)realloc(psVar15,sVar10);
            if (topNode == (snd_config_t *)0x0) {
              *(undefined8 *)(__s + -8) = 0x1139b4;
              PaUtil_DebugPrint(
                               "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1342\n"
                               );
              return -0x2708;
            }
          }
          pPVar6 = baseApi;
          *(undefined8 *)(__s + -8) = 0x1139dd;
          paUtilErr_ = PaAlsa_StrDup((PaAlsaHostApiRepresentation *)pPVar6,&deviceName,
                                     (char *)&alsaDeviceName);
          if (paUtilErr_ < 0) {
            *(undefined8 *)(__s + -8) = 0x113a04;
            PaUtil_DebugPrint(
                             "Expression \'PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1345\n"
                             );
            return paUtilErr_;
          }
          *(char **)(topNode + (maxDeviceNames - 1) * 0x20) = deviceName;
          *(char **)(topNode + (maxDeviceNames - 1) * 0x20 + 8) = infoName;
          *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x10) = hwPrefix._4_4_;
          *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x14) = __pa_unsure_error_id;
          *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x18) = local_140;
        }
      }
      *(undefined8 *)(__s + -8) = 0x113ab5;
      (*alsa_snd_ctl_close)(psVar3);
    }
  }
  if (*alsa_snd_config == (snd_config_ft)0x0) {
    *(undefined8 *)(__s + -8) = 0x113ad4;
    i_1._4_4_ = (*(code *)alsa_snd_config_update)();
    if (i_1._4_4_ < 0) {
      *(undefined8 *)(__s + -8) = 0x113af2;
      pVar12 = pthread_self();
      *(undefined8 *)(__s + -8) = 0x113b04;
      iVar8 = pthread_equal(pVar12,paUnixMainThread);
      iVar7 = i_1._4_4_;
      if (iVar8 != 0) {
        local_1e8 = (long)i_1._4_4_;
        *(undefined8 *)(__s + -8) = 0x113b26;
        pcVar9 = (*alsa_snd_strerror)(iVar7);
        lVar20 = local_1e8;
        *(undefined8 *)(__s + -8) = 0x113b3a;
        PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
      }
      *(undefined8 *)(__s + -8) = 0x113b48;
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_config_update()\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1360\n"
                       );
      return -9999;
    }
  }
  if (*alsa_snd_config == (snd_config_ft)0x0) {
    *(undefined8 *)(__s + -8) = 0x113b86;
    __assert_fail("*alsa_snd_config",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                  ,0x553,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
  }
  psVar15 = *alsa_snd_config;
  *(undefined8 *)(__s + -8) = 0x113ba4;
  iVar7 = (*alsa_snd_config_search)(psVar15,"pcm",(snd_config_t **)&pcmInfo);
  psVar5 = pcmInfo;
  if (-1 < iVar7) {
    *(undefined8 *)(__s + -8) = 0x113bbd;
    p_Var13 = (snd_config_iterator_t)(*(code *)alsa_snd_config_iterator_first)(psVar5);
    next = p_Var13;
    *(undefined8 *)(__s + -8) = 0x113bd4;
    tpStr = (char *)(*alsa_snd_config_iterator_next)(p_Var13);
    while( true ) {
      psVar5 = pcmInfo;
      local_1f0 = next;
      *(undefined8 *)(__s + -8) = 0x113bf6;
      p_Var14 = (snd_config_iterator_t)(*(code *)alsa_snd_config_iterator_end)(psVar5);
      p_Var13 = next;
      if (local_1f0 == p_Var14) break;
      idStr = "unknown";
      pcStack_168 = (char *)0x0;
      alsaDeviceName_1._4_4_ = 0;
      n = (snd_config_t *)0x0;
      *(undefined8 *)(__s + -8) = 0x113c47;
      psVar15 = (*alsa_snd_config_iterator_entry)(p_Var13);
      ___pa_unsure_error_id_2 = (snd_config_t *)0x0;
      tp = psVar15;
      *(undefined8 *)(__s + -8) = 0x113c77;
      alsaDeviceName_1._4_4_ =
           (*alsa_snd_config_search)(psVar15,"type",(snd_config_t **)&__pa_unsure_error_id_2);
      psVar15 = ___pa_unsure_error_id_2;
      if (alsaDeviceName_1._4_4_ < 0) {
        if ((alsaDeviceName_1._4_4_ != -2) &&
           (__pa_unsure_error_id_3 = alsaDeviceName_1._4_4_, alsaDeviceName_1._4_4_ < 0)) {
          *(undefined8 *)(__s + -8) = 0x113cbd;
          pVar12 = pthread_self();
          *(undefined8 *)(__s + -8) = 0x113ccf;
          iVar8 = pthread_equal(pVar12,paUnixMainThread);
          iVar7 = __pa_unsure_error_id_3;
          if (iVar8 != 0) {
            local_1f8 = (long)__pa_unsure_error_id_3;
            *(undefined8 *)(__s + -8) = 0x113cf1;
            pcVar9 = (*alsa_snd_strerror)(iVar7);
            lVar20 = local_1f8;
            *(undefined8 *)(__s + -8) = 0x113d05;
            PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
          }
          *(undefined8 *)(__s + -8) = 0x113d13;
          PaUtil_DebugPrint(
                           "Expression \'err\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1381\n"
                           );
          return -9999;
        }
      }
      else {
        *(undefined8 *)(__s + -8) = 0x113d41;
        local_1a0 = (*(code *)alsa_snd_config_get_string)(psVar15,&idStr);
        if (local_1a0 < 0) {
          *(undefined8 *)(__s + -8) = 0x113d5f;
          pVar12 = pthread_self();
          *(undefined8 *)(__s + -8) = 0x113d71;
          iVar8 = pthread_equal(pVar12,paUnixMainThread);
          iVar7 = local_1a0;
          if (iVar8 != 0) {
            local_200 = (long)local_1a0;
            *(undefined8 *)(__s + -8) = 0x113d93;
            pcVar9 = (*alsa_snd_strerror)(iVar7);
            lVar20 = local_200;
            *(undefined8 *)(__s + -8) = 0x113da7;
            PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
          }
          *(undefined8 *)(__s + -8) = 0x113db5;
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_config_get_string( tp, &tpStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1386\n"
                           );
          return -9999;
        }
      }
      psVar15 = tp;
      *(undefined8 *)(__s + -8) = 0x113dde;
      devInfo._4_4_ = (*(code *)alsa_snd_config_get_id)(psVar15,&stack0xfffffffffffffe98);
      pcVar9 = pcStack_168;
      if (devInfo._4_4_ < 0) {
        *(undefined8 *)(__s + -8) = 0x113dfc;
        pVar12 = pthread_self();
        *(undefined8 *)(__s + -8) = 0x113e0e;
        iVar8 = pthread_equal(pVar12,paUnixMainThread);
        iVar7 = devInfo._4_4_;
        if (iVar8 != 0) {
          local_208 = (long)devInfo._4_4_;
          *(undefined8 *)(__s + -8) = 0x113e30;
          pcVar9 = (*alsa_snd_strerror)(iVar7);
          lVar20 = local_208;
          *(undefined8 *)(__s + -8) = 0x113e44;
          PaUtil_SetLastHostErrorInfo(paALSA,lVar20,pcVar9);
        }
        *(undefined8 *)(__s + -8) = 0x113e52;
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_config_get_id( n, &idStr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1388\n"
                         );
        return -9999;
      }
      *(undefined8 *)(__s + -8) = 0x113e6c;
      iVar7 = IgnorePlugin(pcVar9);
      pcVar9 = pcStack_168;
      if (iVar7 == 0) {
        local_210 = (PaUtilAllocationGroup *)baseApi[3].Terminate;
        *(undefined8 *)(__s + -8) = 0x113e96;
        sVar10 = strlen(pcVar9);
        pPVar1 = local_210;
        *(undefined8 *)(__s + -8) = 0x113ea9;
        pcVar16 = (char *)PaUtil_GroupAllocateMemory(pPVar1,sVar10 + 6);
        pcVar9 = pcStack_168;
        deviceName_1 = pcVar16;
        if (pcVar16 == (char *)0x0) {
          *(undefined8 *)(__s + -8) = 0x113ed2;
          PaUtil_DebugPrint(
                           "Expression \'alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 6 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1397\n"
                           );
          return -0x2708;
        }
        *(undefined8 *)(__s + -8) = 0x113ef3;
        strcpy(pcVar16,pcVar9);
        pcVar9 = pcStack_168;
        local_218 = (PaUtilAllocationGroup *)baseApi[3].Terminate;
        *(undefined8 *)(__s + -8) = 0x113f11;
        sVar10 = strlen(pcVar9);
        pPVar1 = local_218;
        *(undefined8 *)(__s + -8) = 0x113f24;
        pHVar17 = (HwDevInfo *)PaUtil_GroupAllocateMemory(pPVar1,sVar10 + 1);
        pcVar9 = pcStack_168;
        predefined = pHVar17;
        if (pHVar17 == (HwDevInfo *)0x0) {
          *(undefined8 *)(__s + -8) = 0x113f4d;
          PaUtil_DebugPrint(
                           "Expression \'deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations, strlen(idStr) + 1 )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1400\n"
                           );
          return -0x2708;
        }
        *(undefined8 *)(__s + -8) = 0x113f6e;
        strcpy((char *)pHVar17,pcVar9);
        psVar15 = topNode;
        maxDeviceNames = maxDeviceNames + 1;
        if ((topNode == (snd_config_t *)0x0) || (i < maxDeviceNames)) {
          sVar10 = i << 6;
          i = i << 1;
          *(undefined8 *)(__s + -8) = 0x113fa7;
          topNode = (snd_config_t *)realloc(psVar15,sVar10);
          if (topNode == (snd_config_t *)0x0) {
            *(undefined8 *)(__s + -8) = 0x113fcd;
            PaUtil_DebugPrint(
                             "Expression \'hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1408\n"
                             );
            return -0x2708;
          }
        }
        pcVar9 = deviceName_1;
        *(undefined8 *)(__s + -8) = 0x113fe9;
        n = (snd_config_t *)FindDeviceName(pcVar9);
        *(char **)(topNode + (maxDeviceNames - 1) * 0x20) = deviceName_1;
        *(HwDevInfo **)(topNode + (maxDeviceNames - 1) * 0x20 + 8) = predefined;
        *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x10) = 1;
        if ((HwDevInfo *)n == (HwDevInfo *)0x0) {
          *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x14) = 1;
          *(undefined4 *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x18) = 1;
        }
        else {
          *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x14) = ((HwDevInfo *)n)->hasPlayback;
          *(int *)(topNode + (maxDeviceNames - 1) * 0x20 + 0x18) = ((HwDevInfo *)n)->hasCapture;
        }
      }
      pcVar9 = tpStr;
      next = (snd_config_iterator_t)tpStr;
      *(undefined8 *)(__s + -8) = 0x1140e5;
      tpStr = (char *)(*alsa_snd_config_iterator_next)((snd_config_iterator_t)pcVar9);
    }
  }
  pPVar1 = (PaUtilAllocationGroup *)baseApi[3].Terminate;
  lVar20 = maxDeviceNames << 3;
  *(undefined8 *)(__s + -8) = 0x11410f;
  pvVar18 = PaUtil_GroupAllocateMemory(pPVar1,lVar20);
  (deviceInfoArray->baseDeviceInfo).defaultLowOutputLatency = (PaTime)pvVar18;
  if (pvVar18 == (void *)0x0) {
    *(undefined8 *)(__s + -8) = 0x114139;
    PaUtil_DebugPrint(
                     "Expression \'baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1434\n"
                     );
    numDeviceNames._4_4_ = -0x2708;
  }
  else {
    pPVar1 = (PaUtilAllocationGroup *)baseApi[3].Terminate;
    lVar20 = maxDeviceNames * 0x60;
    *(undefined8 *)(__s + -8) = 0x11415e;
    _devIdx = PaUtil_GroupAllocateMemory(pPVar1,lVar20);
    if (_devIdx == (void *)0x0) {
      *(undefined8 *)(__s + -8) = 0x114184;
      PaUtil_DebugPrint(
                       "Expression \'deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory( alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1438\n"
                       );
      numDeviceNames._4_4_ = -0x2708;
    }
    else {
      cardInfo._0_4_ = 0;
      for (hwDevInfos = (HwDevInfo *)0x0; hwDevInfos < maxDeviceNames;
          hwDevInfos = (HwDevInfo *)((long)&hwDevInfos->alsaName + 1)) {
        hwInfo = (HwDevInfo *)((long)_devIdx + (long)hwDevInfos * 0x60);
        devInfo_1 = (PaAlsaDeviceInfo *)(topNode + (long)hwDevInfos * 0x20);
        pcVar9 = (devInfo_1->baseDeviceInfo).name;
        *(undefined8 *)(__s + -8) = 0x1141ef;
        iVar7 = strcmp(pcVar9,"dmix");
        if (iVar7 != 0) {
          pcVar9 = (devInfo_1->baseDeviceInfo).name;
          *(undefined8 *)(__s + -8) = 0x11420b;
          iVar7 = strcmp(pcVar9,"default");
          pPVar6 = baseApi;
          pHVar17 = hwInfo;
          deviceHwInfo = devInfo_1;
          if (iVar7 != 0) {
            *(undefined8 *)(__s + -8) = 0x114232;
            paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)pPVar6,
                                       (HwDevInfo *)deviceHwInfo,local_70,
                                       (PaAlsaDeviceInfo *)pHVar17,(int *)&cardInfo);
            if (paUtilErr_ < 0) {
              *(undefined8 *)(__s + -8) = 0x114259;
              PaUtil_DebugPrint(
                               "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1458\n"
                               );
              return paUtilErr_;
            }
          }
        }
      }
      if (maxDeviceNames < (ulong)(long)(int)cardInfo) {
        *(undefined8 *)(__s + -8) = 0x1142a7;
        __assert_fail("devIdx <= numDeviceNames",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c"
                      ,0x5b4,"PaError BuildDeviceList(PaAlsaHostApiRepresentation *)");
      }
      for (hwDevInfos = (HwDevInfo *)0x0; psVar15 = topNode, hwDevInfos < maxDeviceNames;
          hwDevInfos = (HwDevInfo *)((long)&hwDevInfos->alsaName + 1)) {
        hwInfo_1 = (HwDevInfo *)((long)_devIdx + (long)hwDevInfos * 0x60);
        local_1c8 = (HwDevInfo *)(topNode + (long)hwDevInfos * 0x20);
        pcVar9 = local_1c8->name;
        *(undefined8 *)(__s + -8) = 0x1142fd;
        iVar7 = strcmp(pcVar9,"dmix");
        if (iVar7 == 0) {
LAB_00114320:
          pPVar6 = baseApi;
          devInfo_00 = hwInfo_1;
          pHVar17 = local_1c8;
          *(undefined8 *)(__s + -8) = 0x114340;
          paUtilErr_ = FillInDevInfo((PaAlsaHostApiRepresentation *)pPVar6,pHVar17,local_70,
                                     (PaAlsaDeviceInfo *)devInfo_00,(int *)&cardInfo);
          if (paUtilErr_ < 0) {
            *(undefined8 *)(__s + -8) = 0x114367;
            PaUtil_DebugPrint(
                             "Expression \'FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_25/philburk[P]portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1471\n"
                             );
            return paUtilErr_;
          }
        }
        else {
          pcVar9 = local_1c8->name;
          *(undefined8 *)(__s + -8) = 0x114319;
          iVar7 = strcmp(pcVar9,"default");
          if (iVar7 == 0) goto LAB_00114320;
        }
      }
      *(undefined8 *)(__s + -8) = 0x114390;
      free(psVar15);
      (deviceInfoArray->baseDeviceInfo).maxOutputChannels = (int)cardInfo;
    }
  }
  return numDeviceNames._4_4_;
}

Assistant:

static PaError BuildDeviceList( PaAlsaHostApiRepresentation *alsaApi )
{
    PaUtilHostApiRepresentation *baseApi = &alsaApi->baseHostApiRep;
    PaAlsaDeviceInfo *deviceInfoArray;
    int cardIdx = -1, devIdx = 0;
    snd_ctl_card_info_t *cardInfo;
    PaError result = paNoError;
    size_t numDeviceNames = 0, maxDeviceNames = 1, i;
    HwDevInfo *hwDevInfos = NULL;
    snd_config_t *topNode = NULL;
    snd_pcm_info_t *pcmInfo;
    int res;
    int blocking = SND_PCM_NONBLOCK;
    int usePlughw = 0;
    char *hwPrefix = "";
    char alsaCardName[50];
#ifdef PA_ENABLE_DEBUG_OUTPUT
    PaTime startTime = PaUtil_GetTime();
#endif

    if( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) && atoi( getenv( "PA_ALSA_INITIALIZE_BLOCK" ) ) )
        blocking = 0;

    /* If PA_ALSA_PLUGHW is 1 (non-zero), use the plughw: pcm throughout instead of hw: */
    if( getenv( "PA_ALSA_PLUGHW" ) && atoi( getenv( "PA_ALSA_PLUGHW" ) ) )
    {
        usePlughw = 1;
        hwPrefix = "plug";
        PA_DEBUG(( "%s: Using Plughw\n", __FUNCTION__ ));
    }

    /* These two will be set to the first working input and output device, respectively */
    baseApi->info.defaultInputDevice = paNoDevice;
    baseApi->info.defaultOutputDevice = paNoDevice;

    /* Gather info about hw devices

     * alsa_snd_card_next() modifies the integer passed to it to be:
     *      the index of the first card if the parameter is -1
     *      the index of the next card if the parameter is the index of a card
     *      -1 if there are no more cards
     *
     * The function itself returns 0 if it succeeded. */
    cardIdx = -1;
    alsa_snd_ctl_card_info_alloca( &cardInfo );
    alsa_snd_pcm_info_alloca( &pcmInfo );
    while( alsa_snd_card_next( &cardIdx ) == 0 && cardIdx >= 0 )
    {
        char *cardName;
        int devIdx = -1;
        snd_ctl_t *ctl;
        char buf[50];

        snprintf( alsaCardName, sizeof (alsaCardName), "hw:%d", cardIdx );

        /* Acquire name of card */
        if( alsa_snd_ctl_open( &ctl, alsaCardName, 0 ) < 0 )
        {
            /* Unable to open card :( */
            PA_DEBUG(( "%s: Unable to open device %s\n", __FUNCTION__, alsaCardName ));
            continue;
        }
        alsa_snd_ctl_card_info( ctl, cardInfo );

        PA_ENSURE( PaAlsa_StrDup( alsaApi, &cardName, alsa_snd_ctl_card_info_get_name( cardInfo )) );

        while( alsa_snd_ctl_pcm_next_device( ctl, &devIdx ) == 0 && devIdx >= 0 )
        {
            char *alsaDeviceName, *deviceName, *infoName;
            size_t len;
            int hasPlayback = 0, hasCapture = 0;

            snprintf( buf, sizeof (buf), "%s%s,%d", hwPrefix, alsaCardName, devIdx );

            /* Obtain info about this particular device */
            alsa_snd_pcm_info_set_device( pcmInfo, devIdx );
            alsa_snd_pcm_info_set_subdevice( pcmInfo, 0 );
            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_CAPTURE );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasCapture = 1;
            }

            alsa_snd_pcm_info_set_stream( pcmInfo, SND_PCM_STREAM_PLAYBACK );
            if( alsa_snd_ctl_pcm_info( ctl, pcmInfo ) >= 0 )
            {
                hasPlayback = 1;
            }

            if( !hasPlayback && !hasCapture )
            {
                /* Error */
                continue;
            }

            infoName = SkipCardDetailsInName( (char *)alsa_snd_pcm_info_get_name( pcmInfo ), cardName );

            /* The length of the string written by snprintf plus terminating 0 */
            len = snprintf( NULL, 0, "%s: %s (%s)", cardName, infoName, buf ) + 1;
            PA_UNLESS( deviceName = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
                    paInsufficientMemory );
            snprintf( deviceName, len, "%s: %s (%s)", cardName, infoName, buf );

            PA_DEBUG(( "%s: Found device [%d]: %s\n", __FUNCTION__, numDeviceNames, deviceName ));

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            PA_ENSURE( PaAlsa_StrDup( alsaApi, &alsaDeviceName, buf ) );

            hwDevInfos[ numDeviceNames - 1 ].alsaName = alsaDeviceName;
            hwDevInfos[ numDeviceNames - 1 ].name = deviceName;
            hwDevInfos[ numDeviceNames - 1 ].isPlug = usePlughw;
            hwDevInfos[ numDeviceNames - 1 ].hasPlayback = hasPlayback;
            hwDevInfos[ numDeviceNames - 1 ].hasCapture = hasCapture;
        }
        alsa_snd_ctl_close( ctl );
    }

    /* Iterate over plugin devices */
    if( NULL == (*alsa_snd_config) )
    {
        /* alsa_snd_config_update is called implicitly by some functions, if this hasn't happened snd_config will be NULL (bleh) */
        ENSURE_( alsa_snd_config_update(), paUnanticipatedHostError );
        PA_DEBUG(( "Updating snd_config\n" ));
    }
    assert( *alsa_snd_config );
    if( ( res = alsa_snd_config_search( *alsa_snd_config, "pcm", &topNode ) ) >= 0 )
    {
        snd_config_iterator_t i, next;

        alsa_snd_config_for_each( i, next, topNode )
        {
            const char *tpStr = "unknown", *idStr = NULL;
            int err = 0;

            char *alsaDeviceName, *deviceName;
            const HwDevInfo *predefined = NULL;
            snd_config_t *n = alsa_snd_config_iterator_entry( i ), * tp = NULL;;

            if( (err = alsa_snd_config_search( n, "type", &tp )) < 0 )
            {
                if( -ENOENT != err )
                {
                    ENSURE_(err, paUnanticipatedHostError);
                }
            }
            else
            {
                ENSURE_( alsa_snd_config_get_string( tp, &tpStr ), paUnanticipatedHostError );
            }
            ENSURE_( alsa_snd_config_get_id( n, &idStr ), paUnanticipatedHostError );
            if( IgnorePlugin( idStr ) )
            {
                PA_DEBUG(( "%s: Ignoring ALSA plugin device [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));
                continue;
            }
            PA_DEBUG(( "%s: Found plugin [%s] of type [%s]\n", __FUNCTION__, idStr, tpStr ));

            PA_UNLESS( alsaDeviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 6 ), paInsufficientMemory );
            strcpy( alsaDeviceName, idStr );
            PA_UNLESS( deviceName = (char*)PaUtil_GroupAllocateMemory( alsaApi->allocations,
                                                            strlen(idStr) + 1 ), paInsufficientMemory );
            strcpy( deviceName, idStr );

            ++numDeviceNames;
            if( !hwDevInfos || numDeviceNames > maxDeviceNames )
            {
                maxDeviceNames *= 2;
                PA_UNLESS( hwDevInfos = (HwDevInfo *) realloc( hwDevInfos, maxDeviceNames * sizeof (HwDevInfo) ),
                        paInsufficientMemory );
            }

            predefined = FindDeviceName( alsaDeviceName );

            hwDevInfos[numDeviceNames - 1].alsaName = alsaDeviceName;
            hwDevInfos[numDeviceNames - 1].name     = deviceName;
            hwDevInfos[numDeviceNames - 1].isPlug   = 1;

            if( predefined )
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = predefined->hasPlayback;
                hwDevInfos[numDeviceNames - 1].hasCapture  = predefined->hasCapture;
            }
            else
            {
                hwDevInfos[numDeviceNames - 1].hasPlayback = 1;
                hwDevInfos[numDeviceNames - 1].hasCapture  = 1;
            }
        }
    }
    else
        PA_DEBUG(( "%s: Iterating over ALSA plugins failed: %s\n", __FUNCTION__, alsa_snd_strerror( res ) ));

    /* allocate deviceInfo memory based on the number of devices */
    PA_UNLESS( baseApi->deviceInfos = (PaDeviceInfo**)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaDeviceInfo*) * (numDeviceNames) ), paInsufficientMemory );

    /* allocate all device info structs in a contiguous block */
    PA_UNLESS( deviceInfoArray = (PaAlsaDeviceInfo*)PaUtil_GroupAllocateMemory(
            alsaApi->allocations, sizeof(PaAlsaDeviceInfo) * numDeviceNames ), paInsufficientMemory );

    /* Loop over list of cards, filling in info. If a device is deemed unavailable (can't get name),
     * it's ignored.
     *
     * Note that we do this in two stages. This is a workaround owing to the fact that the 'dmix'
     * plugin may cause the underlying hardware device to be busy for a short while even after it
     * (dmix) is closed. The 'default' plugin may also point to the dmix plugin, so the same goes
     * for this.
     */
    PA_DEBUG(( "%s: Filling device info for %d devices\n", __FUNCTION__, numDeviceNames ));
    for( i = 0, devIdx = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( !strcmp( hwInfo->name, "dmix" ) || !strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    assert( devIdx <= numDeviceNames );
    /* Now inspect 'dmix' and 'default' plugins */
    for( i = 0; i < numDeviceNames; ++i )
    {
        PaAlsaDeviceInfo* devInfo = &deviceInfoArray[i];
        HwDevInfo* hwInfo = &hwDevInfos[i];
        if( strcmp( hwInfo->name, "dmix" ) && strcmp( hwInfo->name, "default" ) )
        {
            continue;
        }

        PA_ENSURE( FillInDevInfo( alsaApi, hwInfo, blocking, devInfo, &devIdx ) );
    }
    free( hwDevInfos );

    baseApi->info.deviceCount = devIdx;   /* Number of successfully queried devices */

#ifdef PA_ENABLE_DEBUG_OUTPUT
    PA_DEBUG(( "%s: Building device list took %f seconds\n", __FUNCTION__, PaUtil_GetTime() - startTime ));
#endif

end:
    return result;

error:
    /* No particular action */
    goto end;
}